

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O0

void __thiscall
HighsSymmetryDetection::run(HighsSymmetryDetection *this,HighsSymmetries *symmetries)

{
  int iVar1;
  const_iterator __position;
  const_iterator __position_00;
  bool bVar2;
  HighsInt HVar3;
  HighsInt HVar4;
  HighsInt HVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  int *piVar9;
  reference pvVar10;
  ValueType *pVVar11;
  vector<int,_std::allocator<int>_> *this_00;
  int *piVar12;
  long in_RSI;
  long in_RDI;
  HighsInt i_8;
  HighsInt outPos;
  HighsInt i_7;
  HighsInt *permOutput;
  HighsInt *permEnd;
  HighsInt *perms;
  HighsInt p_1;
  HighsInt i_6;
  HighsInt numFixed;
  HighsInt i_5;
  HighsInt *perm;
  HighsInt p;
  HighsHashTable<int,_void> deletedPerms;
  HighsInt i_4;
  HighsInt numComponents;
  ComponentData componentData;
  bool success;
  Node *currNode;
  HighsInt possibleBacktrackDepth_1;
  HighsInt possibleBacktrackDepth;
  HighsInt i_3;
  bool report_1;
  HighsInt bestLeaveCol;
  HighsInt i_2;
  HighsInt *permutation_1;
  HighsInt k_1;
  HighsInt i_1;
  bool report;
  HighsInt firstLeaveCol;
  HighsInt i;
  HighsInt *permutation;
  HighsInt k;
  HighsInt backtrackDepth_1;
  HighsInt wrongCell;
  HighsInt backtrackDepth;
  HighsInt targetCell;
  HighsSplitDeque *workerDeque;
  HighsInt maxPerms;
  undefined4 in_stack_fffffffffffffc88;
  HighsInt in_stack_fffffffffffffc8c;
  value_type vVar13;
  HighsSplitDeque *in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffc9c;
  HighsSymmetryDetection *in_stack_fffffffffffffca0;
  HighsSymmetryDetection *in_stack_fffffffffffffca8;
  HighsSymmetryDetection *in_stack_fffffffffffffcb0;
  HighsHashTable<int,_int> *in_stack_fffffffffffffcb8;
  int *in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  HighsSymmetryDetection *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  int iVar14;
  undefined4 in_stack_fffffffffffffcdc;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  value_type in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf4;
  HighsSymmetryDetection *in_stack_fffffffffffffcf8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd34;
  byte local_2a1;
  int local_294;
  int local_290;
  int local_28c;
  int *local_288;
  HighsSymmetryDetection *in_stack_fffffffffffffd88;
  int local_26c;
  int local_268;
  int local_264;
  int local_254;
  HighsSymmetries *in_stack_fffffffffffffdc0;
  HighsSymmetryDetection *in_stack_fffffffffffffdc8;
  int local_228;
  int local_210 [32];
  HighsSymmetries *in_stack_fffffffffffffe70;
  HighsInt in_stack_fffffffffffffe7c;
  ComponentData *in_stack_fffffffffffffe80;
  HighsSymmetryDetection *in_stack_fffffffffffffe88;
  int local_d0;
  int local_cc;
  int *local_c8;
  int *local_c0;
  int local_b0;
  byte local_a9;
  int local_a8;
  int local_a4;
  int *local_a0;
  uint local_94;
  int *local_90;
  int *local_88;
  int local_78;
  byte local_71;
  int local_70;
  int local_6c;
  int *local_68;
  uint local_60;
  int local_5c;
  int local_58;
  int local_54;
  HighsInt local_24;
  HighsSplitDeque *local_20;
  int local_14;
  long local_10;
  
  local_10 = in_RSI;
  initializeGroundSet(in_stack_fffffffffffffcd0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x6cb7c0);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x6cb7d4);
  createNode((HighsSymmetryDetection *)in_stack_fffffffffffffc90);
  local_14 = (int)(64000000 / (long)*(int *)(in_RDI + 0x2b0));
  local_20 = HighsTaskExecutor::getThisWorkerDeque();
  while (bVar2 = std::
                 vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                 ::empty((vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                          *)in_stack_fffffffffffffca0), ((bVar2 ^ 0xffU) & 1) != 0) {
    local_24 = selectTargetCell((HighsSymmetryDetection *)
                                CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    if (local_24 == -1) {
      bVar2 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0);
      if (bVar2) {
        std::vector<int,_std::allocator<int>_>::operator=
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                   in_stack_fffffffffffffd28);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd28)
        ;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd28)
        ;
        dumpCurrentGraph(in_stack_fffffffffffffcf8);
        HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::operator=
                  ((HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)
                   in_stack_fffffffffffffc90,
                   (HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)
                   CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::~HighsHashTable
                  ((HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)
                   in_stack_fffffffffffffc90);
        sVar6 = std::
                vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                ::size((vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                        *)(in_RDI + 0x2b8));
        *(int *)(in_RDI + 0x298) = (int)sVar6;
        sVar6 = std::
                vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                ::size((vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                        *)(in_RDI + 0x2b8));
        *(int *)(in_RDI + 0x29c) = (int)sVar6;
        sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1a0));
        *(int *)(in_RDI + 0x290) = (int)sVar6;
        sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1a0));
        *(int *)(in_RDI + 0x294) = (int)sVar6;
        iVar1 = *(int *)(in_RDI + 0x298);
        do {
          local_54 = iVar1 + -1;
          local_2a1 = 0;
          if (0 < local_54) {
            std::vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
            ::operator[]((vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                          *)(in_RDI + 0x2b8),(long)(iVar1 + -2));
            bVar2 = isFromBinaryColumn((HighsSymmetryDetection *)
                                       CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98)
                                       ,(HighsInt)((ulong)in_stack_fffffffffffffc90 >> 0x20));
            local_2a1 = bVar2 ^ 0xff;
          }
          iVar1 = local_54;
        } while ((local_2a1 & 1) != 0);
        switchToNextNode(in_stack_fffffffffffffcb0,
                         (HighsInt)((ulong)in_stack_fffffffffffffca8 >> 0x20));
      }
      else {
        local_58 = -1;
        sVar6 = std::
                vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                ::size((vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                        *)(in_RDI + 0x2b8));
        local_5c = (int)sVar6 + -1;
        iVar1 = *(int *)(in_RDI + 0x290);
        sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1a0));
        if ((iVar1 == (int)sVar6) ||
           (iVar1 = *(int *)(in_RDI + 0x294),
           sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              (in_RDI + 0x1a0)), iVar1 == (int)sVar6)) {
          iVar1 = *(int *)(in_RDI + 0x290);
          sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1a0)
                            );
          if ((iVar1 == (int)sVar6) &&
             (bVar2 = compareCurrentGraph(in_stack_fffffffffffffcf8,
                                          (HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>
                                           *)CONCAT44(in_stack_fffffffffffffcf4,
                                                      in_stack_fffffffffffffcf0),
                                          (HighsInt *)
                                          CONCAT44(in_stack_fffffffffffffcec,
                                                   in_stack_fffffffffffffce8)), bVar2)) {
            local_60 = *(uint *)(in_RDI + 0x2a0);
            *(uint *)(in_RDI + 0x2a0) = local_60 + 1;
            local_60 = local_60 & 0x3f;
            local_68 = std::vector<int,_std::allocator<int>_>::data
                                 ((vector<int,_std::allocator<int>_> *)0x6cbb1b);
            local_68 = local_68 + (int)(local_60 * *(int *)(in_RDI + 0x2ac));
            for (local_6c = 0; local_6c < *(int *)(in_RDI + 0x2ac); local_6c = local_6c + 1) {
              pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1e8),
                                   (long)local_6c);
              piVar12 = local_68;
              iVar1 = *pvVar10;
              local_70 = iVar1;
              pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x68),
                                   (long)local_6c);
              pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb0),
                                   (long)*pvVar10);
              piVar12[*pvVar10] = iVar1;
            }
            local_71 = 0;
            for (local_78 = 0; local_78 < *(int *)(in_RDI + 0x2ac); local_78 = local_78 + 1) {
              in_stack_fffffffffffffd34 = local_68[local_78];
              std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 200),(long)local_78);
              bVar2 = mergeOrbits(in_stack_fffffffffffffca8,
                                  (HighsInt)((ulong)in_stack_fffffffffffffca0 >> 0x20),
                                  (HighsInt)in_stack_fffffffffffffca0);
              if ((bVar2) && (local_78 < *(int *)(in_RDI + 0x2b0))) {
                local_71 = 1;
              }
            }
            if ((local_71 & 1) != 0) {
              in_stack_fffffffffffffd28 = (vector<int,_std::allocator<int>_> *)(local_10 + 0x18);
              local_88 = (int *)std::vector<int,_std::allocator<int>_>::end
                                          ((vector<int,_std::allocator<int>_> *)
                                           CONCAT44(in_stack_fffffffffffffc8c,
                                                    in_stack_fffffffffffffc88));
              __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
              __normal_iterator<int*>
                        ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffc90,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
              __position._M_current._4_4_ = in_stack_fffffffffffffcdc;
              __position._M_current._0_4_ = in_stack_fffffffffffffcd8;
              local_90 = (int *)std::vector<int,std::allocator<int>>::insert<int*,void>
                                          ((vector<int,_std::allocator<int>_> *)
                                           in_stack_fffffffffffffcd0,__position,
                                           (int *)CONCAT44(in_stack_fffffffffffffccc,
                                                           in_stack_fffffffffffffcc8),
                                           in_stack_fffffffffffffcc0);
              *(int *)(local_10 + 0xd0) = *(int *)(local_10 + 0xd0) + 1;
              if (*(int *)(local_10 + 0xd0) == local_14) break;
            }
            piVar12 = std::min<int>(&local_5c,(int *)(in_RDI + 0x298));
            local_5c = *piVar12;
          }
          else {
            bVar2 = std::vector<int,_std::allocator<int>_>::empty
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0);
            if (((bVar2) ||
                (iVar1 = *(int *)(in_RDI + 0x294),
                sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   (in_RDI + 0x1a0)), iVar1 != (int)sVar6)) ||
               (bVar2 = compareCurrentGraph(in_stack_fffffffffffffcf8,
                                            (HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>
                                             *)CONCAT44(in_stack_fffffffffffffcf4,
                                                        in_stack_fffffffffffffcf0),
                                            (HighsInt *)
                                            CONCAT44(in_stack_fffffffffffffcec,
                                                     in_stack_fffffffffffffce8)), !bVar2)) {
              in_stack_fffffffffffffcf4 = *(int *)(in_RDI + 0x294);
              sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 (in_RDI + 0x1a0));
              if (in_stack_fffffffffffffcf4 < (int)sVar6) {
                pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                    (in_RDI + 0x1a0),(long)*(int *)(in_RDI + 0x294));
                in_stack_fffffffffffffcf0 = *pvVar7;
                pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                    (in_RDI + 0x1d0),(long)*(int *)(in_RDI + 0x294));
                if (*pvVar7 < in_stack_fffffffffffffcf0) {
                  local_cc = *(int *)(in_RDI + 0x298) + -1;
                  while (pvVar8 = std::
                                  vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                                  ::operator[]((vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                                                *)(in_RDI + 0x2b8),(long)local_cc),
                        pvVar8->certificateEnd <= *(int *)(in_RDI + 0x294)) {
                    local_cc = local_cc + 1;
                  }
                  piVar12 = std::min<int>(&local_cc,&local_5c);
                  local_5c = *piVar12;
                  goto LAB_006cc316;
                }
              }
              for (local_d0 = local_5c; -1 < local_d0; local_d0 = local_d0 + -1) {
                pvVar8 = std::
                         vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                         ::operator[]((vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                                       *)(in_RDI + 0x2b8),(long)local_d0);
                if (pvVar8->targetCell == local_58) {
                  local_5c = local_d0;
                  break;
                }
              }
            }
            else {
              local_94 = *(uint *)(in_RDI + 0x2a0);
              *(uint *)(in_RDI + 0x2a0) = local_94 + 1;
              local_94 = local_94 & 0x3f;
              local_a0 = std::vector<int,_std::allocator<int>_>::data
                                   ((vector<int,_std::allocator<int>_> *)0x6cbe63);
              local_a0 = local_a0 + (int)(local_94 * *(int *)(in_RDI + 0x2ac));
              for (local_a4 = 0; local_a4 < *(int *)(in_RDI + 0x2ac); local_a4 = local_a4 + 1) {
                pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x200),
                                     (long)local_a4);
                piVar12 = local_a0;
                iVar1 = *pvVar10;
                local_a8 = iVar1;
                pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x68),
                                     (long)local_a4);
                pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb0),
                                     (long)*pvVar10);
                piVar12[*pvVar10] = iVar1;
              }
              local_a9 = 0;
              for (local_b0 = 0; local_b0 < *(int *)(in_RDI + 0x2ac); local_b0 = local_b0 + 1) {
                std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 200),(long)local_b0);
                bVar2 = mergeOrbits(in_stack_fffffffffffffca8,
                                    (HighsInt)((ulong)in_stack_fffffffffffffca0 >> 0x20),
                                    (HighsInt)in_stack_fffffffffffffca0);
                if ((bVar2) && (local_b0 < *(int *)(in_RDI + 0x2b0))) {
                  local_a9 = 1;
                }
              }
              if ((local_a9 & 1) != 0) {
                in_stack_fffffffffffffcf8 = (HighsSymmetryDetection *)(local_10 + 0x18);
                local_c0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                            ((vector<int,_std::allocator<int>_> *)
                                             CONCAT44(in_stack_fffffffffffffc8c,
                                                      in_stack_fffffffffffffc88));
                __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
                __normal_iterator<int*>
                          ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                            *)in_stack_fffffffffffffc90,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
                __position_00._M_current._4_4_ = in_stack_fffffffffffffcdc;
                __position_00._M_current._0_4_ = in_stack_fffffffffffffcd8;
                local_c8 = (int *)std::vector<int,std::allocator<int>>::insert<int*,void>
                                            ((vector<int,_std::allocator<int>_> *)
                                             in_stack_fffffffffffffcd0,__position_00,
                                             (int *)CONCAT44(in_stack_fffffffffffffccc,
                                                             in_stack_fffffffffffffcc8),
                                             in_stack_fffffffffffffcc0);
                *(int *)(local_10 + 0xd0) = *(int *)(local_10 + 0xd0) + 1;
                if (*(int *)(local_10 + 0xd0) == local_14) break;
              }
              piVar12 = std::min<int>(&local_5c,(int *)(in_RDI + 0x29c));
              local_5c = *piVar12;
            }
          }
        }
        else {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffffd28);
          dumpCurrentGraph(in_stack_fffffffffffffcf8);
          HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::operator=
                    ((HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)
                     in_stack_fffffffffffffc90,
                     (HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)
                     CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
          HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::~HighsHashTable
                    ((HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)
                     in_stack_fffffffffffffc90);
          std::vector<int,_std::allocator<int>_>::operator=
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                     in_stack_fffffffffffffd28);
          sVar6 = std::
                  vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                  ::size((vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                          *)(in_RDI + 0x2b8));
          *(int *)(in_RDI + 0x29c) = (int)sVar6;
          sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1a0)
                            );
          *(int *)(in_RDI + 0x294) = (int)sVar6;
        }
LAB_006cc316:
        switchToNextNode(in_stack_fffffffffffffcb0,
                         (HighsInt)((ulong)in_stack_fffffffffffffca8 >> 0x20));
      }
      HighsSplitDeque::checkInterrupt(in_stack_fffffffffffffc90);
    }
    else {
      pvVar8 = std::
               vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>::
               back((vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                     *)in_stack_fffffffffffffc90);
      pvVar8->targetCell = local_24;
      determineNextToDistinguish(in_stack_fffffffffffffd88);
      bVar2 = distinguishVertex(in_stack_fffffffffffffca8,
                                (HighsInt)((ulong)in_stack_fffffffffffffca0 >> 0x20));
      if (bVar2) {
        bVar2 = partitionRefinement(in_stack_fffffffffffffd88);
        if (bVar2) {
          createNode((HighsSymmetryDetection *)in_stack_fffffffffffffc90);
        }
        else {
          std::vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>::
          size((vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                *)(in_RDI + 0x2b8));
          switchToNextNode(in_stack_fffffffffffffcb0,
                           (HighsInt)((ulong)in_stack_fffffffffffffca8 >> 0x20));
        }
      }
      else {
        std::vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>::
        size((vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_> *)
             (in_RDI + 0x2b8));
        switchToNextNode(in_stack_fffffffffffffcb0,
                         (HighsInt)((ulong)in_stack_fffffffffffffca8 >> 0x20));
      }
    }
  }
  *(undefined4 *)(local_10 + 0xd4) = *(undefined4 *)(local_10 + 0xd0);
  if (0 < *(int *)(local_10 + 0xd0)) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcb0,
               (size_type)in_stack_fffffffffffffca8);
    piVar12 = local_210;
    computeComponentData(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    HVar3 = ComponentData::numComponents((ComponentData *)0x6cc48a);
    HVar5 = HVar3;
    for (local_228 = 0; local_228 < HVar3; local_228 = local_228 + 1) {
      HVar4 = ComponentData::componentSize
                        ((ComponentData *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
      if (HVar4 != 1) {
        isFullOrbitope(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c
                       ,in_stack_fffffffffffffe70);
      }
    }
    HighsHashTable<int,_void>::HighsHashTable
              ((HighsHashTable<int,_void> *)in_stack_fffffffffffffca0);
    for (local_254 = 0; local_254 < *(int *)(local_10 + 0xd0); local_254 = local_254 + 1) {
      piVar9 = std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)0x6cc578);
      iVar1 = *(int *)(in_RDI + 0x2b0);
      for (local_264 = 0; local_264 < *(int *)(in_RDI + 0x2b0); local_264 = local_264 + 1) {
        iVar14 = piVar9[(long)(local_254 * iVar1) + (long)local_264];
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 200),(long)local_264);
        if ((iVar14 != *pvVar10) &&
           (pVVar11 = HighsHashTable<int,_int>::find
                                (in_stack_fffffffffffffcb8,
                                 (KeyType_conflict *)in_stack_fffffffffffffcb0),
           pVVar11 != (ValueType *)0x0)) {
          HighsHashTable<int,void>::insert<int&>
                    ((HighsHashTable<int,_void> *)CONCAT44(HVar5,in_stack_fffffffffffffce8),piVar12)
          ;
          break;
        }
      }
    }
    local_268 = 0;
    for (local_26c = 0; local_26c < *(int *)(in_RDI + 0x2b0); local_26c = local_26c + 1) {
      this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0xf8);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 200),(long)local_26c);
      HVar5 = getOrbit(in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)HVar5);
      if (*pvVar10 == 1) {
LAB_006cc781:
        in_stack_fffffffffffffca8 = (HighsSymmetryDetection *)(in_RDI + 0xb0);
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 200),(long)local_26c);
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca8,
                             (long)*pvVar10);
        *pvVar10 = -1;
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 200),(long)local_26c);
        *pvVar10 = -1;
        local_268 = local_268 + 1;
      }
      else {
        in_stack_fffffffffffffcb0 = (HighsSymmetryDetection *)(local_10 + 0xa8);
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 200),(long)local_26c);
        in_stack_fffffffffffffcb8 =
             (HighsHashTable<int,_int> *)
             HighsHashTable<int,_int>::find
                       (in_stack_fffffffffffffcb8,(KeyType_conflict *)in_stack_fffffffffffffcb0);
        if (in_stack_fffffffffffffcb8 != (HighsHashTable<int,_int> *)0x0) goto LAB_006cc781;
      }
    }
    if (local_268 != 0) {
      piVar12 = std::vector<int,_std::allocator<int>_>::data
                          ((vector<int,_std::allocator<int>_> *)0x6cc833);
      piVar9 = std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)0x6cc84c);
      iVar1 = *(int *)(local_10 + 0xd0);
      iVar14 = *(int *)(in_RDI + 0x2b0);
      local_288 = std::vector<int,_std::allocator<int>_>::data
                            ((vector<int,_std::allocator<int>_> *)0x6cc88c);
      for (; piVar12 != piVar9 + iVar1 * iVar14; piVar12 = piVar12 + *(int *)(in_RDI + 0x2b0)) {
        in_stack_fffffffffffffca0 =
             (HighsSymmetryDetection *)
             HighsHashTable<int,_void>::find
                       ((HighsHashTable<int,_void> *)in_stack_fffffffffffffcb8,
                        (KeyType_conflict *)in_stack_fffffffffffffcb0);
        if (in_stack_fffffffffffffca0 == (HighsSymmetryDetection *)0x0) {
          for (local_28c = 0; local_28c < *(int *)(in_RDI + 0x2b0); local_28c = local_28c + 1) {
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 200),(long)local_28c
                                );
            if (*pvVar10 != -1) {
              *local_288 = piVar12[local_28c];
              local_288 = local_288 + 1;
            }
          }
        }
        else {
          *(int *)(local_10 + 0xd0) = *(int *)(local_10 + 0xd0) + -1;
        }
      }
      local_290 = 0;
      for (local_294 = 0; local_294 < *(int *)(in_RDI + 0x2b0); local_294 = local_294 + 1) {
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 200),(long)local_294);
        if (*pvVar10 != -1) {
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 200),(long)local_294);
          vVar13 = *pvVar10;
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 200),(long)local_290);
          *pvVar10 = vVar13;
          in_stack_fffffffffffffc90 = (HighsSplitDeque *)(in_RDI + 0xb0);
          in_stack_fffffffffffffc9c = local_290;
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 200),(long)local_290);
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc90,
                               (long)*pvVar10);
          *pvVar10 = in_stack_fffffffffffffc9c;
          local_290 = local_290 + 1;
        }
      }
      *(int *)(in_RDI + 0x2b0) = *(int *)(in_RDI + 0x2b0) - local_268;
    }
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcb0,
               (size_type)in_stack_fffffffffffffca8);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
               (vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
               (vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcb0,
               (size_type)in_stack_fffffffffffffca8);
    HighsHashTable<int,_void>::~HighsHashTable
              ((HighsHashTable<int,_void> *)in_stack_fffffffffffffc90);
    ComponentData::~ComponentData((ComponentData *)in_stack_fffffffffffffc90);
  }
  return;
}

Assistant:

void HighsSymmetryDetection::run(HighsSymmetries& symmetries) {
  assert(numActiveCols != 0);
  initializeGroundSet();
  currNodeCertificate.clear();
  cellCreationStack.clear();
  createNode();
  HighsInt maxPerms = 64000000 / numActiveCols;
  HighsSplitDeque* workerDeque = HighsTaskExecutor::getThisWorkerDeque();
  while (!nodeStack.empty()) {
    HighsInt targetCell = selectTargetCell();
    if (targetCell == -1) {
      if (firstLeavePartition.empty()) {
        firstLeavePartition = currentPartition;
        firstLeaveCertificate = currNodeCertificate;
        bestLeaveCertificate = currNodeCertificate;
        firstLeaveGraph = dumpCurrentGraph();
        firstPathDepth = nodeStack.size();
        bestPathDepth = nodeStack.size();
        firstLeavePrefixLen = currNodeCertificate.size();
        bestLeavePrefixLen = currNodeCertificate.size();

        HighsInt backtrackDepth = firstPathDepth - 1;
        while (backtrackDepth > 0 &&
               !isFromBinaryColumn(nodeStack[backtrackDepth - 1].targetCell))
          --backtrackDepth;
        switchToNextNode(backtrackDepth);
      } else {
        HighsInt wrongCell = -1;
        HighsInt backtrackDepth = nodeStack.size() - 1;
        assert(currNodeCertificate.size() == firstLeaveCertificate.size());
        if (firstLeavePrefixLen == (HighsInt)currNodeCertificate.size() ||
            bestLeavePrefixLen == (HighsInt)currNodeCertificate.size()) {
          if (firstLeavePrefixLen == (HighsInt)currNodeCertificate.size() &&
              compareCurrentGraph(firstLeaveGraph, wrongCell)) {
            HighsInt k = (numAutomorphisms++) & 63;
            HighsInt* permutation = automorphisms.data() + k * numVertices;
            for (HighsInt i = 0; i < numVertices; ++i) {
              HighsInt firstLeaveCol = firstLeavePartition[i];
              permutation[vertexPosition[currentPartition[i]]] = firstLeaveCol;
            }

            bool report = false;
            for (HighsInt i = 0; i < numVertices; ++i) {
              if (mergeOrbits(permutation[i], vertexGroundSet[i]) &&
                  i < numActiveCols) {
                assert(permutation[i] < numCol);
                report = true;
              }
            }

            if (report) {
              symmetries.permutations.insert(symmetries.permutations.end(),
                                             permutation,
                                             permutation + numActiveCols);
              ++symmetries.numPerms;
              if (symmetries.numPerms == maxPerms) break;
            }
            backtrackDepth = std::min(backtrackDepth, firstPathDepth);
          } else if (!bestLeavePartition.empty() &&
                     bestLeavePrefixLen ==
                         (HighsInt)currNodeCertificate.size() &&
                     compareCurrentGraph(bestLeaveGraph, wrongCell)) {
            HighsInt k = (numAutomorphisms++) & 63;
            HighsInt* permutation = automorphisms.data() + k * numVertices;
            for (HighsInt i = 0; i < numVertices; ++i) {
              HighsInt bestLeaveCol = bestLeavePartition[i];
              permutation[vertexPosition[currentPartition[i]]] = bestLeaveCol;
            }

            bool report = false;
            for (HighsInt i = 0; i < numVertices; ++i) {
              if (mergeOrbits(permutation[i], vertexGroundSet[i]) &&
                  i < numActiveCols) {
                assert(permutation[i] < numCol);
                report = true;
              }
            }

            if (report) {
              symmetries.permutations.insert(symmetries.permutations.end(),
                                             permutation,
                                             permutation + numActiveCols);
              ++symmetries.numPerms;
              if (symmetries.numPerms == maxPerms) break;
            }

            backtrackDepth = std::min(backtrackDepth, bestPathDepth);
          } else if (bestLeavePrefixLen <
                         (HighsInt)currNodeCertificate.size() &&
                     currNodeCertificate[bestLeavePrefixLen] >
                         bestLeaveCertificate[bestLeavePrefixLen]) {
            // certificate value is lexicographically above the smallest one
            // seen so far, so we might be able to backtrack to a higher level
            HighsInt possibleBacktrackDepth = firstPathDepth - 1;
            while (nodeStack[possibleBacktrackDepth].certificateEnd <=
                   bestLeavePrefixLen)
              ++possibleBacktrackDepth;

            backtrackDepth = std::min(possibleBacktrackDepth, backtrackDepth);
          } else {
            // This case can be caused by a hash collision which was now
            // detected in the graph comparison call. The graph comparison call
            // will return the cell where the vertex neighbourhood caused a
            // mismatch on the edges. This would have been detected by
            // an exact partition refinement when we targeted that cell the last
            // time, so that is where we can backtrack to.
            HighsInt possibleBacktrackDepth;
            for (possibleBacktrackDepth = backtrackDepth;
                 possibleBacktrackDepth >= 0; --possibleBacktrackDepth) {
              if (nodeStack[possibleBacktrackDepth].targetCell == wrongCell) {
                backtrackDepth = possibleBacktrackDepth;
                break;
              }
            }
          }
        } else {
          // leave must have a lexicographically smaller certificate value
          // than the current best leave, because its prefix length is smaller
          // than the best leaves and it would have been already pruned if
          // it's certificate value was larger unless it is equal to the first
          // leaf nodes certificate value which is caught by the first case
          // of the if condition. Hence, having a lexicographically smaller
          // certificate value than the best leave is the only way to get
          // here.
          assert(bestLeaveCertificate[bestLeavePrefixLen] >
                     currNodeCertificate[bestLeavePrefixLen] &&
                 std::memcmp(bestLeaveCertificate.data(),
                             currNodeCertificate.data(),
                             bestLeavePrefixLen * sizeof(u32)) == 0);
          bestLeaveCertificate = currNodeCertificate;
          bestLeaveGraph = dumpCurrentGraph();
          bestLeavePartition = currentPartition;
          bestPathDepth = nodeStack.size();
          bestLeavePrefixLen = currNodeCertificate.size();
        }

        switchToNextNode(backtrackDepth);
      }

      workerDeque->checkInterrupt();
    } else {
      Node& currNode = nodeStack.back();
      currNode.targetCell = targetCell;
      bool success = determineNextToDistinguish();
      assert(success);
      if (!distinguishVertex(targetCell)) {
        switchToNextNode(nodeStack.size() - 1);
        continue;
      }
      if (!partitionRefinement()) {
        switchToNextNode(nodeStack.size());
        continue;
      }

      createNode();
    }
  }

  symmetries.numGenerators = symmetries.numPerms;
  if (symmetries.numPerms > 0) {
    vertexPosition.resize(numCol);

    ComponentData componentData = computeComponentData(symmetries);
    HighsInt numComponents = componentData.numComponents();

    for (HighsInt i = 0; i < numComponents; ++i) {
      if (componentData.componentSize(i) == 1) continue;

      isFullOrbitope(componentData, i, symmetries);
    }

    HighsHashTable<HighsInt> deletedPerms;
    for (HighsInt p = 0; p < symmetries.numPerms; ++p) {
      HighsInt* perm = symmetries.permutations.data() + p * numActiveCols;
      for (HighsInt i = 0; i < numActiveCols; ++i) {
        if (perm[i] != vertexGroundSet[i] &&
            symmetries.columnToOrbitope.find(perm[i])) {
          deletedPerms.insert(p);
          break;
        }
      }
    }

    // check which columns have non-trivial orbits
    HighsInt numFixed = 0;
    for (HighsInt i = 0; i < numActiveCols; ++i) {
      if (orbitSize[getOrbit(vertexGroundSet[i])] == 1 ||
          symmetries.columnToOrbitope.find(vertexGroundSet[i])) {
        vertexPosition[vertexGroundSet[i]] = -1;
        vertexGroundSet[i] = -1;
        numFixed += 1;
      }
    }

    if (numFixed != 0) {
      // now compress symmetries and the groundset to only contain the unfixed
      // columns and columns not handled by full orbitopes
      HighsInt p = 0;
      HighsInt* perms = symmetries.permutations.data();
      HighsInt* permEnd =
          symmetries.permutations.data() + symmetries.numPerms * numActiveCols;
      HighsInt* permOutput = symmetries.permutations.data();
      while (perms != permEnd) {
        if (!deletedPerms.find(p)) {
          for (HighsInt i = 0; i < numActiveCols; ++i) {
            if (vertexGroundSet[i] == -1) continue;

            *permOutput = perms[i];
            ++permOutput;
          }
        } else {
          --symmetries.numPerms;
        }
        perms += numActiveCols;
        ++p;
      }

      HighsInt outPos = 0;
      for (HighsInt i = 0; i < numActiveCols; ++i) {
        if (vertexGroundSet[i] == -1) continue;

        vertexGroundSet[outPos] = vertexGroundSet[i];
        vertexPosition[vertexGroundSet[outPos]] = outPos;
        outPos += 1;
      }

      numActiveCols -= numFixed;
      assert(permOutput == symmetries.permutations.data() +
                               symmetries.numPerms * numActiveCols);
    }

    vertexGroundSet.resize(numActiveCols);
    symmetries.permutationColumns = std::move(vertexGroundSet);
    symmetries.columnPosition = std::move(vertexPosition);
    symmetries.permutations.resize(symmetries.numPerms * numActiveCols);
  }
}